

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::changeImplColUpper
          (HPresolve *this,HighsInt col,double newUpper,HighsInt originRow)

{
  int oldImplVarUpperSource;
  pointer pdVar1;
  bool bVar2;
  HighsLp *pHVar3;
  long lVar4;
  double *pdVar5;
  HighsInt row;
  HighsInt *pHVar6;
  long lVar7;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  double dVar8;
  double dVar9;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar10;
  HighsInt local_60;
  undefined4 local_5c;
  pointer local_58;
  double local_50;
  HighsInt local_44;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_40;
  HighsLinearSumBounds *local_38;
  
  lVar7 = (long)col;
  local_50 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7];
  oldImplVarUpperSource =
       (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar7];
  pHVar3 = this->model;
  dVar9 = this->primal_feastol;
  dVar8 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] - dVar9;
  local_60 = col;
  local_58 = (pointer)newUpper;
  if ((dVar8 <= local_50) && (newUpper < dVar8)) {
    markChangedCol(this,col);
    pHVar3 = this->model;
    dVar9 = this->primal_feastol;
  }
  dVar8 = (pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7];
  if ((dVar8 <= -INFINITY) ||
     (dVar8 - dVar9 <=
      (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7])) {
    pdVar1 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = dVar9 + pdVar1[lVar7];
    if (dVar9 < local_50) {
      local_5c = (undefined4)CONCAT71((int7)((ulong)pdVar1 >> 8),(double)local_58 <= dVar9);
      goto LAB_00306d17;
    }
  }
  local_5c = 0;
LAB_00306d17:
  if (oldImplVarUpperSource != originRow) {
    if ((oldImplVarUpperSource != -1) &&
       (oldImplVarUpperSource !=
        (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7])) {
      this_00 = &(this->colImplSourceByRow).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[oldImplVarUpperSource]._M_t;
      pVar10 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range(this_00,&local_60);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(this_00,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
    }
    if (originRow != -1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((this->colImplSourceByRow).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + originRow),&local_60);
    }
    (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_60] = originRow;
    lVar7 = (long)local_60;
  }
  (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar7] = (double)local_58;
  if ((char)local_5c == '\0') {
    if (local_50 <= (double)local_58) {
      local_58 = (pointer)local_50;
    }
    if ((this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] <= (double)local_58) {
      return;
    }
  }
  lVar7 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
  if (lVar7 != -1) {
    local_58 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar7;
    pHVar6 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar7;
    local_38 = &this->impliedRowBounds;
    local_40 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->substitutionOpportunities;
    do {
      HighsLinearSumBounds::updatedImplVarUpper
                (local_38,*pHVar6,local_60,*pdVar5,local_50,oldImplVarUpperSource);
      row = *pHVar6;
      if (((char)local_5c != '\0') && (bVar2 = isDualImpliedFree(this,row), bVar2)) {
        local_44 = row;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (local_40,&local_44,&local_60);
        row = *pHVar6;
      }
      markChangedRow(this,row);
      lVar4 = (long)(int)lVar7;
      lVar7 = (long)local_58[lVar4];
      pHVar6 = pHVar6 + (lVar7 - lVar4);
      pdVar5 = pdVar5 + (lVar7 - lVar4);
    } while (lVar7 != -1);
  }
  return;
}

Assistant:

void HPresolve::changeImplColUpper(HighsInt col, double newUpper,
                                   HighsInt originRow) {
  double oldImplUpper = implColUpper[col];
  HighsInt oldUpperSource = colUpperSource[col];
  if (oldImplUpper >= model->col_upper_[col] - primal_feastol &&
      newUpper < model->col_upper_[col] - primal_feastol) {
    // the dual constraint can be considered a >= constraint and was free, or a
    // <= constraint before
    markChangedCol(col);
  }
  bool newImpliedFree =
      isLowerImplied(col) &&
      oldImplUpper > model->col_upper_[col] + primal_feastol &&
      newUpper <= model->col_upper_[col] + primal_feastol;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originRow) {
    if (oldUpperSource != -1 && oldUpperSource != colLowerSource[col])
      colImplSourceByRow[oldUpperSource].erase(col);
    if (originRow != -1) colImplSourceByRow[originRow].emplace(col);

    colUpperSource[col] = originRow;
  }

  // update implied bound
  implColUpper[col] = newUpper;

  // if the old and the new implied bound are not better than the upper bound,
  // nothing needs to be updated
  if (!newImpliedFree &&
      std::min(oldImplUpper, newUpper) >= model->col_upper_[col])
    return;

  for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
    impliedRowBounds.updatedImplVarUpper(nonzero.index(), col, nonzero.value(),
                                         oldImplUpper, oldUpperSource);
    if (newImpliedFree && isDualImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(nonzero.index(), col);

    markChangedRow(nonzero.index());
  }
}